

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O2

void __thiscall
icu_63::RegexCompile::compile(RegexCompile *this,UText *pat,UParseError *pp,UErrorCode *e)

{
  RegexPatternChar *c;
  byte bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  RegexPattern *pRVar5;
  UnicodeSet **ppUVar6;
  UBool UVar7;
  uint uVar8;
  int iVar9;
  int32_t iVar10;
  UText *pUVar11;
  int64_t iVar12;
  UnicodeSet *this_00;
  Regex8BitSet *__s;
  EVP_PKEY_CTX *ctx;
  ulong uVar13;
  char *pcVar14;
  RegexPatternChar *p;
  size_t size;
  UMemory *this_01;
  ulong uVar15;
  UMemory *__n;
  ulong uVar16;
  
  this->fStatus = e;
  this->fParseErr = pp;
  this->fStackPtr = 0;
  this->fStack[0] = 0;
  if (U_ZERO_ERROR < *e) {
    return;
  }
  pUVar11 = utext_clone_63(this->fRXPat->fPattern,pat,'\0','\x01',e);
  pRVar5 = this->fRXPat;
  pRVar5->fPattern = pUVar11;
  ppUVar6 = RegexStaticSets::gStaticSets;
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    pRVar5->fStaticSets = RegexStaticSets::gStaticSets;
    pRVar5->fStaticSets8 = (Regex8BitSet *)(ppUVar6 + 0xd);
    iVar12 = utext_nativeLength_63(pat);
    this->fPatternLength = iVar12;
    if ((this->fModeFlags & 0x10) != 0) {
      this->fQuoteMode = '\x01';
    }
    c = &this->fC;
    p = c;
    nextChar(this,c);
    uVar13 = 1;
    while (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      pcVar14 = gRuleParseStateTable + uVar13 * 8 + 7;
      while( true ) {
        bVar1 = pcVar14[-3];
        cVar2 = (this->fC).fQuoted;
        uVar3 = (this->fC).fChar;
        uVar8 = (uint)bVar1;
        if ((uVar3 == uVar8 && cVar2 == '\0') && bVar1 < 0x7f) break;
        if (bVar1 == 0xfe) {
          if (cVar2 != '\0') break;
        }
        else if ((uVar8 == 0xff) || (uVar8 == 0xfd && uVar3 == 0xffffffff)) break;
        if (((cVar2 == '\0' && uVar3 != 0xffffffff) && (char)bVar1 < -0x10) &&
           (UVar7 = UnicodeSet::contains
                              ((UnicodeSet *)
                               (RegexStaticSets::gStaticSets + (ulong)(uVar8 & 0x7f) * 0xb + 0x41),
                               uVar3), UVar7 != '\0')) break;
        pcVar14 = pcVar14 + 8;
      }
      p = (RegexPatternChar *)(ulong)*(uint *)(pcVar14 + -7);
      UVar7 = doParseActions(this,*(uint *)(pcVar14 + -7));
      if (UVar7 == '\0') {
        if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
          allocateStackData(this,2);
          stripNOPs(this);
          size = 3;
          iVar10 = minMatchLength(this,3,this->fRXPat->fCompiledPat->count + -1);
          this->fRXPat->fMinMatchLen = iVar10;
          matchStartType(this);
          uVar3 = this->fRXPat->fSets->count;
          __n = (UMemory *)((long)(int)uVar3 << 5);
          this_01 = (UMemory *)0xffffffffffffffff;
          if (-1 < (long)(int)uVar3) {
            this_01 = __n;
          }
          __s = (Regex8BitSet *)UMemory::operator_new__(this_01,size);
          if (__s != (Regex8BitSet *)0x0) {
            if (uVar3 != 0) {
              memset(__s,0,(size_t)__n);
            }
            this->fRXPat->fSets8 = __s;
            uVar16 = 0;
            uVar13 = (ulong)uVar3;
            if ((int)uVar3 < 1) {
              uVar13 = uVar16;
            }
            for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
              ctx = (EVP_PKEY_CTX *)UVector::elementAt(this->fRXPat->fSets,(int32_t)uVar15);
              Regex8BitSet::init((Regex8BitSet *)(this->fRXPat->fSets8->d + uVar16),ctx);
              uVar16 = uVar16 + 0x20;
            }
            return;
          }
          this->fRXPat->fSets8 = (Regex8BitSet *)0x0;
          *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
          *e = U_MEMORY_ALLOCATION_ERROR;
          return;
        }
        break;
      }
      bVar1 = pcVar14[-1];
      if (bVar1 != 0) {
        iVar4 = this->fStackPtr;
        iVar9 = iVar4 + 1;
        this->fStackPtr = iVar9;
        if (0x62 < iVar4) {
          p = (RegexPatternChar *)0x10300;
          error(this,U_REGEX_ERROR_START);
          iVar9 = this->fStackPtr + -1;
          this->fStackPtr = iVar9;
        }
        this->fStack[iVar9] = (ushort)bVar1;
      }
      if (*pcVar14 != '\0') {
        p = c;
        nextChar(this,c);
      }
      uVar13 = (ulong)(byte)pcVar14[-2];
      if (pcVar14[-2] == 0xff) {
        iVar9 = this->fStackPtr;
        uVar13 = (ulong)this->fStack[iVar9];
        this->fStackPtr = iVar9 + -1;
        if ((long)iVar9 < 1) {
          this->fStackPtr = iVar9;
          p = (RegexPatternChar *)0x10306;
          error(this,U_REGEX_MISMATCHED_PAREN);
        }
      }
    }
    while ((this->fSetStack).super_UVector.count != 0) {
      this_00 = (UnicodeSet *)UStack::pop(&this->fSetStack);
      if (this_00 != (UnicodeSet *)0x0) {
        UnicodeSet::~UnicodeSet(this_00);
      }
      UMemory::operator_delete((UMemory *)this_00,p);
    }
  }
  return;
}

Assistant:

void    RegexCompile::compile(
                         UText *pat,                 // Source pat to be compiled.
                         UParseError &pp,            // Error position info
                         UErrorCode &e)              // Error Code
{
    fStatus             = &e;
    fParseErr           = &pp;
    fStackPtr           = 0;
    fStack[fStackPtr]   = 0;

    if (U_FAILURE(*fStatus)) {
        return;
    }

    // There should be no pattern stuff in the RegexPattern object.  They can not be reused.
    U_ASSERT(fRXPat->fPattern == NULL || utext_nativeLength(fRXPat->fPattern) == 0);

    // Prepare the RegexPattern object to receive the compiled pattern.
    fRXPat->fPattern        = utext_clone(fRXPat->fPattern, pat, FALSE, TRUE, fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }
    fRXPat->fStaticSets     = RegexStaticSets::gStaticSets->fPropSets;
    fRXPat->fStaticSets8    = RegexStaticSets::gStaticSets->fPropSets8;


    // Initialize the pattern scanning state machine
    fPatternLength = utext_nativeLength(pat);
    uint16_t                state = 1;
    const RegexTableEl      *tableEl;

    // UREGEX_LITERAL force entire pattern to be treated as a literal string.
    if (fModeFlags & UREGEX_LITERAL) {
        fQuoteMode = TRUE;
    }

    nextChar(fC);                        // Fetch the first char from the pattern string.

    //
    // Main loop for the regex pattern parsing state machine.
    //   Runs once per state transition.
    //   Each time through optionally performs, depending on the state table,
    //      - an advance to the the next pattern char
    //      - an action to be performed.
    //      - pushing or popping a state to/from the local state return stack.
    //   file regexcst.txt is the source for the state table.  The logic behind
    //     recongizing the pattern syntax is there, not here.
    //
    for (;;) {
        //  Bail out if anything has gone wrong.
        //  Regex pattern parsing stops on the first error encountered.
        if (U_FAILURE(*fStatus)) {
            break;
        }

        U_ASSERT(state != 0);

        // Find the state table element that matches the input char from the pattern, or the
        //    class of the input character.  Start with the first table row for this
        //    state, then linearly scan forward until we find a row that matches the
        //    character.  The last row for each state always matches all characters, so
        //    the search will stop there, if not before.
        //
        tableEl = &gRuleParseStateTable[state];
        REGEX_SCAN_DEBUG_PRINTF(("char, line, col = (\'%c\', %d, %d)    state=%s ",
            fC.fChar, fLineNum, fCharNum, RegexStateNames[state]));

        for (;;) {    // loop through table rows belonging to this state, looking for one
                      //   that matches the current input char.
            REGEX_SCAN_DEBUG_PRINTF(("."));
            if (tableEl->fCharClass < 127 && fC.fQuoted == FALSE &&   tableEl->fCharClass == fC.fChar) {
                // Table row specified an individual character, not a set, and
                //   the input character is not quoted, and
                //   the input character matched it.
                break;
            }
            if (tableEl->fCharClass == 255) {
                // Table row specified default, match anything character class.
                break;
            }
            if (tableEl->fCharClass == 254 && fC.fQuoted)  {
                // Table row specified "quoted" and the char was quoted.
                break;
            }
            if (tableEl->fCharClass == 253 && fC.fChar == (UChar32)-1)  {
                // Table row specified eof and we hit eof on the input.
                break;
            }

            if (tableEl->fCharClass >= 128 && tableEl->fCharClass < 240 &&   // Table specs a char class &&
                fC.fQuoted == FALSE &&                                       //   char is not escaped &&
                fC.fChar != (UChar32)-1) {                                   //   char is not EOF
                U_ASSERT(tableEl->fCharClass <= 137);
                if (RegexStaticSets::gStaticSets->fRuleSets[tableEl->fCharClass-128].contains(fC.fChar)) {
                    // Table row specified a character class, or set of characters,
                    //   and the current char matches it.
                    break;
                }
            }

            // No match on this row, advance to the next  row for this state,
            tableEl++;
        }
        REGEX_SCAN_DEBUG_PRINTF(("\n"));

        //
        // We've found the row of the state table that matches the current input
        //   character from the rules string.
        // Perform any action specified  by this row in the state table.
        if (doParseActions(tableEl->fAction) == FALSE) {
            // Break out of the state machine loop if the
            //   the action signalled some kind of error, or
            //   the action was to exit, occurs on normal end-of-rules-input.
            break;
        }

        if (tableEl->fPushState != 0) {
            fStackPtr++;
            if (fStackPtr >= kStackSize) {
                error(U_REGEX_INTERNAL_ERROR);
                REGEX_SCAN_DEBUG_PRINTF(("RegexCompile::parse() - state stack overflow.\n"));
                fStackPtr--;
            }
            fStack[fStackPtr] = tableEl->fPushState;
        }

        //
        //  NextChar.  This is where characters are actually fetched from the pattern.
        //             Happens under control of the 'n' tag in the state table.
        //
        if (tableEl->fNextChar) {
            nextChar(fC);
        }

        // Get the next state from the table entry, or from the
        //   state stack if the next state was specified as "pop".
        if (tableEl->fNextState != 255) {
            state = tableEl->fNextState;
        } else {
            state = fStack[fStackPtr];
            fStackPtr--;
            if (fStackPtr < 0) {
                // state stack underflow
                // This will occur if the user pattern has mis-matched parentheses,
                //   with extra close parens.
                //
                fStackPtr++;
                error(U_REGEX_MISMATCHED_PAREN);
            }
        }

    }

    if (U_FAILURE(*fStatus)) {
        // Bail out if the pattern had errors.
        //   Set stack cleanup:  a successful compile would have left it empty,
        //   but errors can leave temporary sets hanging around.
        while (!fSetStack.empty()) {
            delete (UnicodeSet *)fSetStack.pop();
        }
        return;
    }

    //
    // The pattern has now been read and processed, and the compiled code generated.
    //

    //
    // The pattern's fFrameSize so far has accumulated the requirements for
    //   storage for capture parentheses, counters, etc. that are encountered
    //   in the pattern.  Add space for the two variables that are always
    //   present in the saved state:  the input string position (int64_t) and
    //   the position in the compiled pattern.
    //
    allocateStackData(RESTACKFRAME_HDRCOUNT);

    //
    // Optimization pass 1: NOPs, back-references, and case-folding
    //
    stripNOPs();

    //
    // Get bounds for the minimum and maximum length of a string that this
    //   pattern can match.  Used to avoid looking for matches in strings that
    //   are too short.
    //
    fRXPat->fMinMatchLen = minMatchLength(3, fRXPat->fCompiledPat->size()-1);

    //
    // Optimization pass 2: match start type
    //
    matchStartType();

    //
    // Set up fast latin-1 range sets
    //
    int32_t numSets = fRXPat->fSets->size();
    fRXPat->fSets8 = new Regex8BitSet[numSets];
    // Null pointer check.
    if (fRXPat->fSets8 == NULL) {
        e = *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    int32_t i;
    for (i=0; i<numSets; i++) {
        UnicodeSet *s = (UnicodeSet *)fRXPat->fSets->elementAt(i);
        fRXPat->fSets8[i].init(s);
    }

}